

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_err_Error.cpp
# Opt level: O2

size_t axl::err::pushError(ErrorRef *error)

{
  size_t sVar1;
  Error stack;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_28;
  
  getLastError();
  Error::Error(&stack,(ErrorRef *)&local_28);
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&local_28);
  sVar1 = Error::push(&stack,error);
  if (sVar1 == 0xffffffffffffffff) {
    sVar1 = 0xffffffffffffffff;
  }
  else {
    sVar1 = setError((ErrorRef *)&stack);
  }
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef
            ((BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *)&stack);
  return sVar1;
}

Assistant:

size_t
pushError(const ErrorRef& error) {
	Error stack = getLastError();
	size_t result = stack.push(error);
	return result != -1 ? setError(stack) : -1;
}